

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protodec.c
# Opt level: O0

void protodec_generate_nmea(demod_state_t *d,int bufferlen,int fillbits,time_t received_t)

{
  int iVar1;
  unsigned_long uVar2;
  char cVar3;
  byte local_37;
  byte local_36;
  byte local_35;
  int local_34;
  uchar letter;
  uchar nmeachk;
  uchar sentencenum;
  uchar sentences;
  int m;
  int offset;
  int k;
  int pos;
  int senlen;
  time_t received_t_local;
  int fillbits_local;
  int bufferlen_local;
  demod_state_t *d_local;
  
  if (bufferlen < 0x151) {
    local_35 = 1;
  }
  else {
    local_35 = (byte)(bufferlen / 0x150);
    if (bufferlen % 0x150 != 0) {
      local_35 = local_35 + 1;
    }
  }
  local_36 = 0;
  offset = 0;
  m = 0xe;
  iVar1 = m;
  if (1 < local_35) {
    m = 0xf;
    iVar1 = m;
  }
  do {
    for (; m < iVar1 + 0x38 && offset < bufferlen; m = m + 1) {
      uVar2 = protodec_henten(offset,6,d->rbuffer);
      cVar3 = '8';
      if ((byte)uVar2 < 0x28) {
        cVar3 = '0';
      }
      d->nmea[m] = (byte)uVar2 + cVar3;
      offset = offset + 6;
    }
    local_36 = local_36 + 1;
    builtin_strncpy(d->nmea,"!AIVDM,0,0,",0xb);
    d->nmea[7] = d->nmea[7] + local_35;
    d->nmea[9] = d->nmea[9] + local_36;
    builtin_strncpy(d->nmea + m,",0*00",6);
    if (local_35 < 2) {
      d->nmea[0xb] = ',';
      d->nmea[0xc] = d->chanid;
      d->nmea[0xd] = ',';
    }
    else {
      d->nmea[0xb] = d->seqnr + '0';
      d->nmea[0xc] = ',';
      d->nmea[0xd] = d->chanid;
      d->nmea[0xe] = ',';
      if (local_36 == local_35) {
        d->nmea[m + 1] = (char)fillbits + '0';
      }
    }
    local_37 = d->nmea[1];
    for (local_34 = 2; d->nmea[local_34] != '*'; local_34 = local_34 + 1) {
      local_37 = local_37 ^ d->nmea[local_34];
    }
    sprintf(d->nmea + (m + 3),"%02X\r\n",(ulong)local_37);
    if (on_nmea_sentence_received != (decoder_on_nmea_sentence_received)0x0) {
      (*on_nmea_sentence_received)(d->nmea,m + 7,local_35,local_36);
    }
    m = iVar1;
  } while (local_36 < local_35);
  return;
}

Assistant:

void protodec_generate_nmea(struct demod_state_t *d, int bufferlen, int fillbits, time_t received_t)
{
	int senlen;
	int pos;
    int k, offset;
	int m;
    unsigned char sentences, sentencenum, nmeachk, letter;
	
	//6bits to nmea-ascii. One sentence len max 82char
	//inc. head + tail.This makes inside datamax 62char multipart, 62 single
    senlen = 56;		//this is normally not needed.For testing only. May be fixed number
    if (bufferlen <= (senlen * 6)) {
		sentences = 1;
	} else {
		sentences = bufferlen / (senlen * 6);
		//sentences , if overflow put one more
		if (bufferlen % (senlen * 6) != 0)
			sentences++;
	};

    sentencenum = 0;
	pos = 0;
    offset = (sentences>1) ? 15 : 14;
	do {
        k = offset;		//leave room for nmea header
        while (k < senlen + offset && bufferlen > pos) {
            letter = (unsigned char)protodec_henten(pos, 6, d->rbuffer);
			// 6bit-to-ascii conversion by IEC
            letter += (letter < 40) ? 48 : 56;
			d->nmea[k] = letter;
			pos += 6;
			k++;
		}
		sentencenum++;
		
        memcpy(&d->nmea[0], "!AIVDM,0,0,", 11);
        d->nmea[7] += sentences;
        d->nmea[9] += sentencenum;

        memcpy(&d->nmea[k], ",0*00\0", 6);
		
		if (sentences > 1) {
            d->nmea[11] = '0' + d->seqnr;
            d->nmea[12] = ',';
            d->nmea[13] = d->chanid;
            d->nmea[14] = ',';
            if (sentencenum == sentences) d->nmea[k + 1] = '0' + fillbits;
        } else {
            d->nmea[11] = ',';
            d->nmea[12] = d->chanid;
            d->nmea[13] = ',';
		}

        m = 1;
        nmeachk = d->nmea[m++];
        while (d->nmea[m] != '*') nmeachk ^= d->nmea[m++];

        sprintf(&d->nmea[k + 3], "%02X\r\n", nmeachk);
        if (on_nmea_sentence_received != NULL)
            on_nmea_sentence_received(d->nmea, k+7, sentences, sentencenum);
    } while (sentencenum < sentences);
}